

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O2

vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
vk::enumerateInstanceExtensionProperties
          (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
           *__return_storage_ptr__,PlatformInterface *vkp,char *layerName)

{
  VkResult VVar1;
  long lVar2;
  TestError *this;
  deUint32 numExtensions;
  
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  numExtensions = 0;
  VVar1 = (*vkp->_vptr_PlatformInterface[2])(vkp,layerName,&numExtensions,0);
  checkResult(VVar1,"vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xc2);
  if ((ulong)numExtensions != 0) {
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::resize
              (__return_storage_ptr__,(ulong)numExtensions);
    VVar1 = (*vkp->_vptr_PlatformInterface[2])
                      (vkp,layerName,&numExtensions,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,
                "vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, &properties[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,199);
    lVar2 = (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    if (lVar2 / 0x104 != (ulong)numExtensions) {
      this = (TestError *)__cxa_allocate_exception(0x38,0x104,lVar2 % 0x104);
      tcu::TestError::TestError
                (this,(char *)0x0,"(size_t)numExtensions == properties.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,200);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkExtensionProperties> enumerateInstanceExtensionProperties (const PlatformInterface& vkp, const char* layerName)
{
	vector<VkExtensionProperties>	properties;
	deUint32						numExtensions	= 0;

	VK_CHECK(vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, DE_NULL));

	if (numExtensions > 0)
	{
		properties.resize(numExtensions);
		VK_CHECK(vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, &properties[0]));
		TCU_CHECK((size_t)numExtensions == properties.size());
	}

	return properties;
}